

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void clask::sort_handlers(node *n)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference n_00;
  _node *v;
  iterator __end1;
  iterator __begin1;
  vector<clask::_node,_std::allocator<clask::_node>_> *__range1;
  node *n_local;
  
  iVar2 = std::vector<clask::_node,_std::allocator<clask::_node>_>::begin(&n->children);
  iVar3 = std::vector<clask::_node,_std::allocator<clask::_node>_>::end(&n->children);
  std::
  sort<__gnu_cxx::__normal_iterator<clask::_node*,std::vector<clask::_node,std::allocator<clask::_node>>>,clask::sort_handlers(clask::_node&)::_lambda(clask::_node_const&,clask::_node_const&)_1_>
            (iVar2._M_current,iVar3._M_current);
  __end1 = std::vector<clask::_node,_std::allocator<clask::_node>_>::begin(&n->children);
  v = (_node *)std::vector<clask::_node,_std::allocator<clask::_node>_>::end(&n->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                                *)&v);
    if (!bVar1) break;
    n_00 = __gnu_cxx::
           __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
           ::operator*(&__end1);
    sort_handlers(n_00);
    __gnu_cxx::
    __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

inline void sort_handlers(node& n) {
  std::sort(
    n.children.begin(),
    n.children.end(),
    [](const node& x, const node& y){ return x.name > y.name; }
  );
  for (auto& v : n.children) {
    sort_handlers(v);
  }
}